

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void __thiscall network::Network::setPort(Network *this,unsigned_short port)

{
  bool bVar1;
  _func_int ***ppp_Var2;
  execution_context eVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  wait_op *op;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op_00;
  runtime_error *this_00;
  ulong uVar9;
  ulong __val;
  service *psVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint __len;
  long in_FS_OFFSET;
  io_service service;
  function<void_(const_boost::system::error_code_&,_unsigned_long)> onRead;
  string testQuery;
  string res;
  deadline_timer stopTimer;
  socket sock;
  deadline_timer queryTimer;
  char buf [1024];
  io_context local_628;
  io_service *local_618;
  undefined8 uStack_610;
  code *local_608;
  code *pcStack_600;
  long *local_5f8;
  size_t local_5f0;
  long local_5e8 [2];
  undefined1 *local_5d8;
  size_t local_5d0;
  undefined1 local_5c8;
  undefined7 uStack_5c7;
  error_code local_5b8;
  undefined1 local_5a8 [8];
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_5a0;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pwStack_598;
  error_category *local_590;
  _Alloc_hider local_588;
  size_type local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  undefined1 local_568 [16];
  undefined1 uStack_558;
  undefined3 uStack_557;
  undefined4 uStack_554;
  per_timer_data pStack_550;
  executor_type local_528;
  undefined1 local_4f8 [80];
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_4a8;
  undefined1 local_438 [1032];
  
  boost::asio::io_context::io_context(&local_628);
  this->port_ = port;
  uVar8 = time((time_t *)0x0);
  __val = -uVar8;
  if (0 < (long)uVar8) {
    __val = uVar8;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = __val;
    uVar6 = 4;
    do {
      __len = uVar6;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_0014d34b;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_0014d34b;
      }
      if (uVar9 < 10000) goto LAB_0014d34b;
      bVar1 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      uVar6 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_0014d34b:
  local_5f8 = local_5e8;
  std::__cxx11::string::_M_construct((ulong)&local_5f8,(char)__len - (char)((long)uVar8 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_5f8 - ((long)uVar8 >> 0x3f)),__len,__val);
  local_5d8 = &local_5c8;
  local_5d0 = 0;
  local_5c8 = 0;
  memset(local_438,0,0x400);
  local_568._0_8_ = (impl_type)0x186a0;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            ((basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&local_4a8,&local_628,(duration_type *)local_568,(type *)0x0);
  local_568._0_8_ = local_4f8;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_4f8._0_8_ = this;
  local_4f8._8_8_ = &local_5f8;
  op = (wait_op *)
       boost::asio::detail::thread_info_base::
       allocate<boost::asio::detail::thread_info_base::default_tag>(uVar11,0x68);
  local_568._8_4_ = SUB84(op,0);
  uVar4 = local_568._8_4_;
  local_568._12_4_ = (undefined4)((ulong)op >> 0x20);
  uVar5 = local_568._12_4_;
  _uStack_558 = 0;
  uStack_554 = 0;
  (op->super_operation).next_ = (scheduler_operation *)0x0;
  (op->super_operation).func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:108:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_operation).task_result_ = 0;
  (op->ec_).val_ = 0;
  (op->ec_).failed_ = false;
  (op->ec_).cat_ =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  op[1].super_operation.next_ = (scheduler_operation *)local_4f8._0_8_;
  op[1].super_operation.func_ = (func_type)local_4f8._8_8_;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                       *)&op[1].super_operation.task_result_,&local_4a8.executor_);
  local_4a8.implementation_.might_have_pending_waits = true;
  _uStack_558 = uVar4;
  uStack_554 = uVar5;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::time_traits<boost::posix_time::ptime>>
            ((local_4a8.service_)->scheduler_,&(local_4a8.service_)->timer_queue_,
             &local_4a8.implementation_.expiry,&local_4a8.implementation_.timer_data,op);
  local_568._8_4_ = 0;
  local_568._12_4_ = 0;
  _uStack_558 = 0;
  uStack_554 = 0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:108:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset((ptr *)local_568);
  local_568._8_4_ = 0;
  local_568._12_4_ = 0;
  _uStack_558 = 0;
  uStack_554 = 0;
  pStack_550.op_queue_.front_._0_4_ = 0;
  local_568._2_2_ = this->port_ << 8 | this->port_ >> 8;
  local_568._0_2_ = 2;
  local_568._4_4_ = 0;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_4f8,&local_628,(endpoint_type *)local_568,(type *)0x0);
  local_5a8 = (undefined1  [8])0x30d40;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            ((basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_568,&local_628,(duration_type *)local_5a8,(type *)0x0);
  uVar11 = local_568._0_8_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_618 = &local_628;
  local_5a8 = (undefined1  [8])&local_618;
  op_00 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           *)boost::asio::detail::thread_info_base::
             allocate<boost::asio::detail::thread_info_base::default_tag>(uVar12,0x60);
  pwStack_598 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)0x0;
  (op_00->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
  (op_00->super_wait_op).super_operation.func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op_00->super_wait_op).super_operation.task_result_ = 0;
  (op_00->super_wait_op).ec_.val_ = 0;
  (op_00->super_wait_op).ec_.failed_ = false;
  (op_00->super_wait_op).ec_.cat_ =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  (op_00->handler_).service = local_618;
  local_5a0 = op_00;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op_00->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&local_528);
  uStack_558 = 1;
  pwStack_598 = op_00;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::time_traits<boost::posix_time::ptime>>
            (*(epoll_reactor **)(uVar11 + 0x68),
             (timer_queue<boost::asio::time_traits<boost::posix_time::ptime>_> *)(uVar11 + 0x28),
             (time_type *)(local_568 + 8),&pStack_550,(wait_op *)op_00);
  local_5a0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               *)0x0;
  pwStack_598 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)0x0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset((ptr *)local_5a8);
  local_608 = (code *)0x0;
  pcStack_600 = (code *)0x0;
  local_618 = (io_service *)0x0;
  uStack_610 = 0;
  local_618 = (io_service *)operator_new(0x20);
  (local_618->super_execution_context).service_registry_ = (service_registry *)&local_5d8;
  local_618->impl_ = (impl_type *)local_438;
  local_618[1].super_execution_context.service_registry_ = (service_registry *)local_4f8;
  local_618[1].impl_ = (impl_type *)&local_618;
  pcStack_600 = std::
                _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:118:3)>
                ::_M_invoke;
  local_608 = std::
              _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:118:3)>
              ::_M_manager;
  local_5a0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               *)0x400;
  local_5b8._0_8_ = (service_registry *)local_4f8;
  local_5a8 = (undefined1  [8])local_438;
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::initiate_async_receive::operator()
            ((initiate_async_receive *)&local_5b8,
             (function<void_(const_boost::system::error_code_&,_unsigned_long)> *)&local_618,
             (mutable_buffers_1 *)local_5a8,0);
  local_5b8._0_8_ = local_5b8._0_8_ & 0xffffff0000000000;
  local_5b8.cat_ =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  boost::asio::detail::scheduler::run(local_628.impl_,&local_5b8);
  local_590 = local_5b8.cat_;
  uVar11 = local_5b8._0_8_;
  if (local_5b8.failed_ != true) {
    if ((local_5f0 == local_5d0) &&
       ((local_5f0 == 0 || (iVar7 = bcmp(local_5f8,local_5d8,local_5f0), iVar7 == 0)))) {
      if (local_608 != (code *)0x0) {
        (*local_608)(&local_618,&local_618,3);
      }
      boost::asio::detail::
      io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::~io_object_impl((io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                         *)local_568);
      boost::asio::detail::
      io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                         *)local_4f8);
      boost::asio::detail::
      io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::~io_object_impl(&local_4a8);
      if (local_5d8 != &local_5c8) {
        operator_delete(local_5d8,CONCAT71(uStack_5c7,local_5c8) + 1);
      }
      if (local_5f8 != local_5e8) {
        operator_delete(local_5f8,local_5e8[0] + 1);
      }
      for (psVar10 = (local_628.super_execution_context.service_registry_)->first_service_;
          eVar3.service_registry_ = local_628.super_execution_context.service_registry_,
          psVar10 != (service *)0x0; psVar10 = psVar10->next_) {
        (*psVar10->_vptr_service[2])(psVar10);
      }
      psVar10 = (local_628.super_execution_context.service_registry_)->first_service_;
      while (psVar10 != (service *)0x0) {
        ppp_Var2 = &psVar10->_vptr_service;
        psVar10 = psVar10->next_;
        (*(*ppp_Var2)[1])();
        (eVar3.service_registry_)->first_service_ = psVar10;
      }
      if (local_628.super_execution_context.service_registry_ != (service_registry *)0x0) {
        pthread_mutex_destroy
                  ((pthread_mutex_t *)&(local_628.super_execution_context.service_registry_)->mutex_
                  );
        operator_delete(local_628.super_execution_context.service_registry_,0x40);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Access denied");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::runtime_error::runtime_error((runtime_error *)local_5a8,"");
  local_588._M_p = (pointer)&local_578;
  local_5a8 = (undefined1  [8])&PTR__system_error_00170ba0;
  pwStack_598 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)uVar11;
  local_580 = 0;
  local_578._M_local_buf[0] = '\0';
  boost::throw_exception<boost::system::system_error>((system_error *)local_5a8);
}

Assistant:

void Network::setPort(const unsigned short port)
{
	boost::asio::io_service service;
	port_ = port;
	std::string testQuery = std::to_string(time(0));
	std::string res;
	char buf[PACKAGE_SIZE];
	memset(buf, 0, PACKAGE_SIZE);

	// Timer waits receiver start
	boost::asio::deadline_timer queryTimer(service, boost::posix_time::milliseconds(100));
	queryTimer.async_wait(
		[&](const boost::system::error_code &ex) { sendBroadcast(testQuery); }
	);
	
	// Receive test query
	udp::socket sock(service, udp::endpoint(udp::v4(), port_));
	boost::asio::deadline_timer stopTimer(service, boost::posix_time::milliseconds(200));
	stopTimer.async_wait(
		[&service](const boost::system::error_code &ex) { service.stop(); }
	);
	std::function<void(const boost::system::error_code&, std::size_t)> onRead =
		[&](const boost::system::error_code &err, std::size_t read_bytes)
	{
		res = buf;
		memset(buf, 0, PACKAGE_SIZE);
		sock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);
	};
	sock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);
	service.run();

	if (testQuery != res)
		throw std::runtime_error("Access denied");
}